

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_tpl.h
# Opt level: O1

uint8_t * chunkmemset_safe_sse2(uint8_t *out,uint8_t *from,uint len,uint left)

{
  undefined8 uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong __n;
  uint64_t bytes_remaining;
  uint8_t *cur_chunk;
  undefined4 *__dest;
  undefined1 auVar7 [16];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ulong local_38;
  
  __dest = &local_48;
  __n = (ulong)left;
  if (len < left) {
    __n = (ulong)len;
  }
  uVar6 = (uint)__n;
  if (left < 0x10) {
    if (uVar6 == 0) {
      return out;
    }
    if (left < len) {
      len = left;
    }
    lVar4 = 0;
    do {
      out[lVar4] = from[lVar4];
      lVar4 = lVar4 + 1;
    } while (len != (uint)lVar4);
    return out + lVar4;
  }
  if (len == 0) {
    return out;
  }
  uVar3 = (long)out - (long)from;
  uVar5 = -uVar3;
  if (0 < (long)uVar3) {
    uVar5 = uVar3;
  }
  if (((long)uVar3 < 0) && (uVar5 < __n)) {
    memmove(out,from,__n);
LAB_0011151a:
    return out + __n;
  }
  if (uVar5 == 1) {
    memset(out,(uint)*from,__n);
    goto LAB_0011151a;
  }
  if (0xf < uVar5) {
    uVar2 = uVar6 - 1 & 0xf;
    uVar1 = *(undefined8 *)(from + 8);
    *(undefined8 *)out = *(undefined8 *)from;
    *(undefined8 *)(out + 8) = uVar1;
    if (~uVar2 + uVar6 != 0) {
      lVar4 = (ulong)uVar2 + 1;
      if (left < len) {
        len = left;
      }
      do {
        uVar1 = *(undefined8 *)(from + lVar4 + 8);
        *(undefined8 *)(out + lVar4) = *(undefined8 *)(from + lVar4);
        *(undefined8 *)(out + lVar4 + 8) = uVar1;
        lVar4 = lVar4 + 0x10;
      } while (len != (uint)lVar4);
      return out + lVar4;
    }
    return out + (ulong)uVar2 + 1;
  }
  if (uVar5 == 2) {
    auVar7 = pshuflw(ZEXT216(*(ushort *)from),ZEXT216(*(ushort *)from),0);
    local_48 = auVar7._0_4_;
    uStack_44 = local_48;
  }
  else if (uVar5 == 4) {
    local_48 = *(undefined4 *)from;
    uStack_44 = local_48;
  }
  else {
    if (uVar5 != 8) {
      uVar3 = 0x10;
      local_38 = uVar5;
      do {
        uVar5 = local_38;
        if (uVar3 < local_38) {
          uVar5 = uVar3;
        }
        memcpy(__dest,from,uVar5);
        __dest = (undefined4 *)((long)__dest + uVar5);
        uVar3 = uVar3 - uVar5;
      } while (uVar3 != 0);
      uVar2 = 0x10 - (int)uVar5;
      goto LAB_001115f8;
    }
    local_48 = *(undefined4 *)from;
    uStack_44 = *(undefined4 *)(from + 4);
  }
  uVar2 = 0x10;
  uStack_40 = local_48;
  uStack_3c = uStack_44;
LAB_001115f8:
  if (0x1f < uVar6) {
    do {
      *(ulong *)out = CONCAT44(uStack_44,local_48);
      *(ulong *)(out + 8) = CONCAT44(uStack_3c,uStack_40);
      *(ulong *)(out + uVar2) = CONCAT44(uStack_44,local_48);
      *(ulong *)(out + uVar2 + 8) = CONCAT44(uStack_3c,uStack_40);
      out = out + uVar2 * 2;
      uVar6 = (int)__n + uVar2 * -2;
      __n = (ulong)uVar6;
    } while (0x1f < uVar6);
  }
  uVar6 = (uint)__n;
  if (0xf < uVar6) {
    do {
      *(ulong *)out = CONCAT44(uStack_44,local_48);
      *(ulong *)(out + 8) = CONCAT44(uStack_3c,uStack_40);
      uVar6 = (int)__n - uVar2;
      __n = (ulong)uVar6;
      out = out + uVar2;
    } while (0xf < uVar6);
  }
  if (uVar6 == 0) {
    return out;
  }
  memcpy(out,&local_48,(ulong)uVar6);
  return out + uVar6;
}

Assistant:

Z_INTERNAL uint8_t* CHUNKMEMSET_SAFE(uint8_t *out, uint8_t *from, unsigned len, unsigned left) {
#if OPTIMAL_CMP < 32
    static const uint32_t align_mask = 7;
#elif OPTIMAL_CMP == 32
    static const uint32_t align_mask = 3;
#endif

    len = MIN(len, left);

#if OPTIMAL_CMP < 64
    while (((uintptr_t)out & align_mask) && (len > 0)) {
        *out++ = *from++;
        --len;
        --left;
    }
#endif

#ifndef HAVE_MASKED_READWRITE
    if (UNLIKELY(left < sizeof(chunk_t))) {
        while (len > 0) {
            *out++ = *from++;
            --len;
        }

        return out;
    }
#endif

    if (len)
        out = CHUNKMEMSET(out, from, len);

    return out;
}